

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tessellation_cache.cpp
# Opt level: O3

void __thiscall embree::cache_regression_test::cache_regression_test(cache_regression_test *this)

{
  long lVar1;
  RegressionTest *test;
  long local_40;
  
  test = (RegressionTest *)&stack0xffffffffffffffc8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xffffffffffffffb8,"cache_regression_test","");
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR___cxa_pure_virtual_02185b78
  ;
  (this->super_RegressionTest).name._M_dataplus._M_p =
       (pointer)&(this->super_RegressionTest).name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->super_RegressionTest).name,test,
             (undefined1 *)((long)&test->_vptr_RegressionTest + local_40));
  if (test != (RegressionTest *)&stack0xffffffffffffffc8) {
    operator_delete(test);
  }
  (this->super_RegressionTest)._vptr_RegressionTest = (_func_int **)&PTR_run_02191d30;
  BarrierSys::BarrierSys(&this->barrier,0);
  (this->numFailed).super___atomic_base<unsigned_long>._M_i = 0;
  (this->threadIDCounter).super___atomic_base<int>._M_i = 0;
  lVar1 = 0x48;
  do {
    *(undefined8 *)((long)this->entry + lVar1 + -0x48) = 0;
    *(undefined1 *)
     ((long)&(((cache_regression_test *)(this->entry + -4))->super_RegressionTest).
             _vptr_RegressionTest + lVar1) = 0;
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x10048);
  registerRegressionTest(test);
  return;
}

Assistant:

cache_regression_test() 
      : RegressionTest("cache_regression_test"), numFailed(0), threadIDCounter(0)
    {
      registerRegressionTest(this);
    }